

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropout_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::Dropout_x86_avx512::forward_inplace(Dropout_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  float fVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  int *piVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  float *pfVar16;
  uint uVar17;
  undefined1 local_68 [32];
  Allocator *local_48;
  int iStack_40;
  int iStack_3c;
  undefined1 auStack_38 [12];
  size_t local_28;
  ulong uVar18;
  
  fVar2 = (this->super_Dropout).scale;
  if (fVar2 != 1.0) {
    iVar13 = bottom_top_blob->elempack;
    iVar3 = bottom_top_blob->dims;
    if (iVar13 == 4) {
      uVar4 = bottom_top_blob->w;
      uVar5 = bottom_top_blob->h;
      if (iVar3 == 3) {
        uVar17 = bottom_top_blob->c;
        if (0 < (int)uVar17) {
          uVar15 = 0;
          do {
            if (0 < (int)(uVar5 * uVar4)) {
              pfVar16 = (float *)(bottom_top_blob->cstep * uVar15 * bottom_top_blob->elemsize +
                                 (long)bottom_top_blob->data);
              iVar13 = uVar5 * uVar4;
              do {
                *pfVar16 = fVar2 * *pfVar16;
                pfVar16[1] = fVar2 * pfVar16[1];
                pfVar16[2] = fVar2 * pfVar16[2];
                pfVar16[3] = fVar2 * pfVar16[3];
                pfVar16 = pfVar16 + 4;
                iVar13 = iVar13 + -1;
              } while (iVar13 != 0);
            }
            uVar15 = uVar15 + 1;
          } while (uVar15 != uVar17);
        }
      }
      else if (iVar3 == 2) {
        if (0 < (int)uVar5) {
          uVar15 = 0;
          do {
            if (0 < (int)uVar4) {
              pfVar16 = (float *)((long)bottom_top_blob->w * uVar15 * bottom_top_blob->elemsize +
                                 (long)bottom_top_blob->data);
              uVar18 = (ulong)uVar4;
              do {
                *pfVar16 = fVar2 * *pfVar16;
                pfVar16[1] = fVar2 * pfVar16[1];
                pfVar16[2] = fVar2 * pfVar16[2];
                pfVar16[3] = fVar2 * pfVar16[3];
                pfVar16 = pfVar16 + 4;
                uVar17 = (int)uVar18 - 1;
                uVar18 = (ulong)uVar17;
              } while (uVar17 != 0);
            }
            uVar15 = uVar15 + 1;
          } while (uVar15 != uVar5);
        }
      }
      else if ((iVar3 == 1) && (0 < (int)uVar4)) {
        lVar14 = 0;
        do {
          pfVar16 = (float *)((long)bottom_top_blob->data + lVar14);
          fVar6 = pfVar16[1];
          fVar7 = pfVar16[2];
          fVar8 = pfVar16[3];
          pfVar1 = (float *)((long)bottom_top_blob->data + lVar14);
          *pfVar1 = fVar2 * *pfVar16;
          pfVar1[1] = fVar2 * fVar6;
          pfVar1[2] = fVar2 * fVar7;
          pfVar1[3] = fVar2 * fVar8;
          lVar14 = lVar14 + 0x10;
        } while ((ulong)uVar4 << 4 != lVar14);
      }
    }
    else if (iVar13 == 8) {
      uVar4 = bottom_top_blob->w;
      uVar5 = bottom_top_blob->h;
      if (iVar3 == 3) {
        uVar17 = bottom_top_blob->c;
        if (0 < (int)uVar17) {
          uVar15 = 0;
          do {
            if (0 < (int)(uVar5 * uVar4)) {
              pfVar16 = (float *)(bottom_top_blob->cstep * uVar15 * bottom_top_blob->elemsize +
                                 (long)bottom_top_blob->data);
              iVar13 = uVar5 * uVar4;
              do {
                *pfVar16 = fVar2 * *pfVar16;
                pfVar16[1] = fVar2 * pfVar16[1];
                pfVar16[2] = fVar2 * pfVar16[2];
                pfVar16[3] = fVar2 * pfVar16[3];
                pfVar16[4] = fVar2 * pfVar16[4];
                pfVar16[5] = fVar2 * pfVar16[5];
                pfVar16[6] = fVar2 * pfVar16[6];
                pfVar16[7] = 0.0;
                pfVar16 = pfVar16 + 8;
                iVar13 = iVar13 + -1;
              } while (iVar13 != 0);
            }
            uVar15 = uVar15 + 1;
          } while (uVar15 != uVar17);
        }
      }
      else if (iVar3 == 2) {
        if (0 < (int)uVar5) {
          uVar15 = 0;
          do {
            if (0 < (int)uVar4) {
              pfVar16 = (float *)((long)bottom_top_blob->w * uVar15 * bottom_top_blob->elemsize +
                                 (long)bottom_top_blob->data);
              uVar18 = (ulong)uVar4;
              do {
                *pfVar16 = fVar2 * *pfVar16;
                pfVar16[1] = fVar2 * pfVar16[1];
                pfVar16[2] = fVar2 * pfVar16[2];
                pfVar16[3] = fVar2 * pfVar16[3];
                pfVar16[4] = fVar2 * pfVar16[4];
                pfVar16[5] = fVar2 * pfVar16[5];
                pfVar16[6] = fVar2 * pfVar16[6];
                pfVar16[7] = 0.0;
                pfVar16 = pfVar16 + 8;
                uVar17 = (int)uVar18 - 1;
                uVar18 = (ulong)uVar17;
              } while (uVar17 != 0);
            }
            uVar15 = uVar15 + 1;
          } while (uVar15 != uVar5);
        }
      }
      else if ((iVar3 == 1) && (0 < (int)uVar4)) {
        lVar14 = 0;
        do {
          pfVar16 = (float *)((long)bottom_top_blob->data + lVar14);
          fVar6 = pfVar16[1];
          fVar7 = pfVar16[2];
          fVar8 = pfVar16[3];
          fVar9 = pfVar16[4];
          fVar10 = pfVar16[5];
          fVar11 = pfVar16[6];
          pfVar1 = (float *)((long)bottom_top_blob->data + lVar14);
          *pfVar1 = fVar2 * *pfVar16;
          pfVar1[1] = fVar2 * fVar6;
          pfVar1[2] = fVar2 * fVar7;
          pfVar1[3] = fVar2 * fVar8;
          pfVar1[4] = fVar2 * fVar9;
          pfVar1[5] = fVar2 * fVar10;
          pfVar1[6] = fVar2 * fVar11;
          pfVar1[7] = 0.0;
          lVar14 = lVar14 + 0x20;
        } while ((ulong)uVar4 << 5 != lVar14);
      }
    }
    else {
      if (iVar13 != 0x10) {
        iVar13 = Dropout::forward_inplace(&this->super_Dropout,bottom_top_blob,opt);
        return iVar13;
      }
      local_28 = 0;
      local_68._0_8_ = (void *)0x0;
      local_68._8_4_ = 0;
      local_68._12_4_ = 0;
      local_68._24_4_ = 0;
      local_68._16_8_ = SUB128(ZEXT812(0),4);
      local_48 = (Allocator *)0x0;
      iStack_40 = 0;
      auStack_38._8_4_ = 0;
      auStack_38._0_8_ = SUB128(ZEXT812(0),4);
      iStack_3c = local_68._12_4_;
      convert_packing(bottom_top_blob,(Mat *)local_68,8,opt);
      (*(this->super_Dropout).super_Layer._vptr_Layer[9])(this,local_68,opt);
      convert_packing((Mat *)local_68,bottom_top_blob,0x10,opt);
      piVar12 = (int *)CONCAT44(local_68._12_4_,local_68._8_4_);
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + -1;
        UNLOCK();
        if (*piVar12 == 0) {
          if (local_48 == (Allocator *)0x0) {
            if ((void *)local_68._0_8_ != (void *)0x0) {
              free((void *)local_68._0_8_);
            }
          }
          else {
            (**(code **)(*(long *)local_48 + 0x18))();
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int Dropout_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    if (scale == 1.f)
    {
        return 0;
    }

#if __SSE2__
    int dims = bottom_top_blob.dims;
    int elempack = bottom_top_blob.elempack;

#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        Mat tmp;
        convert_packing(bottom_top_blob, tmp, 8, opt);

        forward_inplace(tmp, opt);

        convert_packing(tmp, bottom_top_blob, 16, opt);

        return 0;
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        __m256 _scale = _mm256_set1_ps(scale);

        if (dims == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 8;
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = _mm256_mul_ps(_p, _scale);
                _mm256_storeu_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _scale);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
            }
        }

        if (dims == 3)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _scale);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        __m128 _scale = _mm_set1_ps(scale);

        if (dims == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 4;
                __m128 _p = _mm_loadu_ps(ptr);
                _p = _mm_mul_ps(_p, _scale);
                _mm_storeu_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_mul_ps(_p, _scale);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
            }
        }

        if (dims == 3)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_mul_ps(_p, _scale);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    return Dropout::forward_inplace(bottom_top_blob, opt);
}